

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O3

void __thiscall
asio::basic_socket<asio::ip::tcp,asio::any_io_executor>::initiate_async_connect::operator()
          (initiate_async_connect *this,function<void_(const_std::error_code_&)> *handler,
          endpoint_type *peer_endpoint,error_code *open_ec)

{
  long lVar1;
  undefined8 *puVar2;
  non_const_lvalue<std::function<void_(const_std::error_code_&)>_&> handler2;
  undefined1 auStack_88 [24];
  object_fns *local_70;
  target_fns *local_68;
  prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
  *local_58;
  _Any_data local_50;
  code *local_40;
  undefined8 local_30;
  error_category *peStack_28;
  
  if (open_ec->_M_value == 0) {
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)auStack_88,handler);
    puVar2 = *(undefined8 **)this;
    asio::detail::reactive_socket_service<asio::ip::tcp>::
    async_connect<std::function<void(std::error_code_const&)>,asio::any_io_executor>
              ((reactive_socket_service<asio::ip::tcp> *)*puVar2,(implementation_type *)(puVar2 + 1)
               ,peer_endpoint,(function<void_(const_std::error_code_&)> *)auStack_88,
               (any_io_executor *)(puVar2 + 4));
    if ((object_fns *)auStack_88._16_8_ != (object_fns *)0x0) {
      (*(code *)auStack_88._16_8_)(auStack_88,auStack_88,3);
    }
  }
  else {
    lVar1 = *(long *)this;
    std::function<void_(const_std::error_code_&)>::function
              ((function<void_(const_std::error_code_&)> *)&local_50,handler);
    local_30 = *(undefined8 *)open_ec;
    peStack_28 = open_ec->_M_cat;
    asio::execution::detail::any_executor_base::any_executor_base
              ((any_executor_base *)auStack_88,(any_executor_base *)(lVar1 + 0x20));
    local_58 = *(prop_fns<asio::execution::any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>_>
                 **)(lVar1 + 0x50);
    asio::detail::initiate_post_with_executor<asio::any_io_executor>::operator()
              ((initiate_post_with_executor<asio::any_io_executor> *)auStack_88,
               (binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)&local_50,
               (enable_if_t<execution::is_executor<conditional_t<true,_executor_type,_binder1<function<void_(const_error_code_&)>,_error_code>_>_>::value>
                *)0x0,(enable_if_t<_detail::is_work_dispatcher_required<decay_t<binder1<function<void_(const_error_code_&)>,_error_code>_>,_any_io_executor>::value>
                       *)0x0);
    if (local_68 != (target_fns *)0x0) {
      (*local_70->destroy)((any_executor_base *)auStack_88);
    }
    if (local_40 != (code *)0x0) {
      (*local_40)(&local_50,&local_50,__destroy_functor);
    }
  }
  return;
}

Assistant:

void operator()(ConnectHandler&& handler,
        const endpoint_type& peer_endpoint,
        const asio::error_code& open_ec) const
    {
      // If you get an error on the following line it means that your handler
      // does not meet the documented type requirements for a ConnectHandler.
      ASIO_CONNECT_HANDLER_CHECK(ConnectHandler, handler) type_check;

      if (open_ec)
      {
          asio::post(self_->impl_.get_executor(),
              asio::detail::bind_handler(
                static_cast<ConnectHandler&&>(handler), open_ec));
      }
      else
      {
        detail::non_const_lvalue<ConnectHandler> handler2(handler);
        self_->impl_.get_service().async_connect(
            self_->impl_.get_implementation(), peer_endpoint,
            handler2.value, self_->impl_.get_executor());
      }
    }